

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_FlateLzwDecode.cc
# Opt level: O2

Pipeline * __thiscall SF_FlateLzwDecode::getDecodePipeline(SF_FlateLzwDecode *this,Pipeline *next)

{
  element_type *peVar1;
  shared_ptr<Pipeline> pipeline;
  uint local_4c;
  uint local_48;
  uint local_44;
  Pipeline *local_40;
  __shared_ptr<Pl_TIFFPredictor,_(__gnu_cxx::_Lock_policy)2> local_38;
  value_type local_28;
  uint local_14;
  
  local_28.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Pipeline *)0x0;
  local_28.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40 = next;
  if (this->predictor - 10U < 6) {
    local_4c = 1;
    local_44 = QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert(&this->columns);
    local_48 = QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert(&this->colors);
    local_14 = QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert
                         (&this->bits_per_component);
    std::
    make_shared<Pl_PNGFilter,char_const(&)[11],Pipeline*&,Pl_PNGFilter::action_e,unsigned_int,unsigned_int,unsigned_int>
              ((char (*) [11])&local_38,(Pipeline **)"png decode",(action_e *)&local_40,&local_4c,
               &local_44,&local_48);
    std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&local_28,
               (__shared_ptr<Pl_PNGFilter,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
              (&this->pipelines,&local_28);
  }
  else {
    if (this->predictor != 2) goto LAB_001fddcc;
    local_4c = 1;
    local_44 = QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert(&this->columns);
    local_48 = QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert(&this->colors);
    local_14 = QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert
                         (&this->bits_per_component);
    std::
    make_shared<Pl_TIFFPredictor,char_const(&)[12],Pipeline*&,Pl_TIFFPredictor::action_e,unsigned_int,unsigned_int,unsigned_int>
              ((char (*) [12])&local_38,(Pipeline **)"tiff decode",(action_e *)&local_40,&local_4c,
               &local_44,&local_48);
    std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&local_28,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
              (&this->pipelines,&local_28);
  }
  local_40 = local_28.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_001fddcc:
  if (this->lzw == true) {
    std::make_shared<Pl_LZWDecoder,char_const(&)[11],Pipeline*&,bool&>
              ((char (*) [11])&local_38,(Pipeline **)"lzw decode",(bool *)&local_40);
    std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&local_28,
               (__shared_ptr<Pl_LZWDecoder,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
  }
  else {
    local_4c = 0;
    std::make_shared<Pl_Flate,char_const(&)[15],Pipeline*&,Pl_Flate::action_e>
              ((char (*) [15])&local_38,(Pipeline **)"stream inflate",(action_e *)&local_40);
    std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&local_28,
               (__shared_ptr<Pl_Flate,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
            (&this->pipelines,&local_28);
  peVar1 = local_28.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return peVar1;
}

Assistant:

Pipeline*
SF_FlateLzwDecode::getDecodePipeline(Pipeline* next)
{
    std::shared_ptr<Pipeline> pipeline;
    if (predictor >= 10 && predictor <= 15) {
        QTC::TC("qpdf", "SF_FlateLzwDecode PNG filter");
        pipeline = std::make_shared<Pl_PNGFilter>(
            "png decode",
            next,
            Pl_PNGFilter::a_decode,
            QIntC::to_uint(columns),
            QIntC::to_uint(colors),
            QIntC::to_uint(bits_per_component));
        pipelines.push_back(pipeline);
        next = pipeline.get();
    } else if (predictor == 2) {
        QTC::TC("qpdf", "SF_FlateLzwDecode TIFF predictor");
        pipeline = std::make_shared<Pl_TIFFPredictor>(
            "tiff decode",
            next,
            Pl_TIFFPredictor::a_decode,
            QIntC::to_uint(columns),
            QIntC::to_uint(colors),
            QIntC::to_uint(bits_per_component));
        pipelines.push_back(pipeline);
        next = pipeline.get();
    }

    if (lzw) {
        pipeline = std::make_shared<Pl_LZWDecoder>("lzw decode", next, early_code_change);
    } else {
        pipeline = std::make_shared<Pl_Flate>("stream inflate", next, Pl_Flate::a_inflate);
    }
    pipelines.push_back(pipeline);
    return pipeline.get();
}